

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::releaseMouse(QWidget *this)

{
  long lVar1;
  
  if (qt_mouseGrb == this) {
    lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    if (lVar1 == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *(long *)(lVar1 + 8);
    }
    if (lVar1 == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *(long *)(lVar1 + 0x20);
    }
    if (lVar1 == 0) {
      lVar1 = 0;
      do {
        this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
        if (this == (QWidget *)0x0) goto LAB_0030ff01;
      } while (this->data->winid == 0);
      lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
      if (lVar1 == 0) {
        lVar1 = 0;
      }
      else {
        lVar1 = *(long *)(lVar1 + 8);
      }
      if (lVar1 == 0) {
        lVar1 = 0;
      }
      else {
        lVar1 = *(long *)(lVar1 + 0x20);
      }
    }
LAB_0030ff01:
    if (lVar1 != 0) {
      if (mouseGrabWithCursor == '\x01') {
        QGuiApplication::restoreOverrideCursor();
        mouseGrabWithCursor = '\0';
      }
      QWindow::setMouseGrabEnabled(SUB81(lVar1,0));
    }
  }
  qt_mouseGrb = (QWidget *)0x0;
  return;
}

Assistant:

static void releaseMouseGrabOfWidget(QWidget *widget)
{
    if (qt_mouseGrb == widget) {
        if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
            if (mouseGrabWithCursor) {
                QGuiApplication::restoreOverrideCursor();
                mouseGrabWithCursor = false;
            }
#endif // !QT_NO_CURSOR
            window->setMouseGrabEnabled(false);
        }
    }
    qt_mouseGrb = nullptr;
}